

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

int __thiscall
kj::anon_unknown_36::ConcurrencyLimitingHttpClient::connect
          (ConcurrencyLimitingHttpClient *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  SourceLocation location;
  SourceLocation location_00;
  HttpClient node;
  OwnPromiseNode node_00;
  ReducePromises<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter> RVar1;
  PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  *pPVar2;
  PromiseBase node_01;
  char *pcVar3;
  HttpClient *pHVar4;
  void *pvVar5;
  int __flags;
  undefined4 in_register_0000000c;
  long lVar6;
  long lVar7;
  PromiseArena *pPVar8;
  void *extraout_RDX;
  void *extraout_RDX_00;
  undefined4 in_register_00000034;
  ConcurrencyLimitingHttpClient *this_00;
  __fn *in_R8;
  __fn *__arg;
  undefined1 *in_R9;
  size_t sVar9;
  TransformPromiseNodeBase *pTVar10;
  SplitTuplePromise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream>_>_>_>
  split;
  PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  paf;
  ConnectRequest response;
  undefined8 in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  HttpClient local_120;
  OwnPromiseNode OStack_118;
  PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  local_110;
  PromiseBase local_f8;
  TransformPromiseNodeBase *local_f0;
  HttpClient local_e8;
  String local_e0;
  HttpHeaders local_c8;
  undefined1 local_68;
  PromiseArena *local_60;
  char *local_58;
  char *pcStack_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined8 local_38;
  
  this_00 = (ConcurrencyLimitingHttpClient *)CONCAT44(in_register_00000034,__fd);
  lVar6 = CONCAT44(in_register_0000000c,__len);
  if (this_00->concurrentRequests < this_00->maxConcurrentRequests) {
    this_00->concurrentRequests = this_00->concurrentRequests + 1;
    local_40 = *in_R9;
    local_38 = *(undefined8 *)(in_R9 + 8);
    local_110.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)this_00;
    (*this_00->inner->_vptr_HttpClient[2])(&local_e8,this_00->inner,__addr,lVar6);
    fireCountChanged(this_00);
    pHVar4 = (HttpClient *)operator_new(0x20);
    pHVar4->_vptr_HttpClient = (_func_int **)&PTR___cxa_pure_virtual_006e1418;
    pHVar4[1]._vptr_HttpClient = (_func_int **)this_00;
    local_110.promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
    pHVar4[2]._vptr_HttpClient = (_func_int **)local_e0.content.ptr;
    pHVar4[3]._vptr_HttpClient = (_func_int **)local_e0.content.size_;
    pPVar8 = (PromiseArena *)0x1;
    if ((PromiseArena *)local_e0.content.size_ != (PromiseArena *)0x0) {
      pPVar8 = (PromiseArena *)local_e0.content.size_;
    }
    pHVar4->_vptr_HttpClient = (_func_int **)&PTR_disposeImpl_00704f90;
    (this->super_HttpClient)._vptr_HttpClient = local_e8._vptr_HttpClient;
    local_e8._vptr_HttpClient = (_func_int **)0x0;
    this->inner = pHVar4;
    *(PromiseArena **)&this->maxConcurrentRequests = pPVar8;
    local_e0.content.ptr = (char *)pHVar4;
    local_e0.content.size_ = (size_t)pPVar8;
    ConnectionCounter::~ConnectionCounter((ConnectionCounter *)&local_110);
  }
  else {
    location.function = (char *)in_stack_fffffffffffffed0;
    location.fileName = (char *)in_stack_fffffffffffffec8;
    location._16_8_ = in_stack_fffffffffffffed8;
    lVar7 = lVar6;
    __arg = in_R8;
    newPromiseAndFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
              (&local_110,location);
    __flags = (int)lVar7;
    sVar9 = lVar6 - 1;
    local_e8._vptr_HttpClient = (_func_int **)this_00;
    heapString(&local_e0,sVar9);
    pvVar5 = extraout_RDX;
    if (sVar9 != 0) {
      pPVar8 = (PromiseArena *)local_e0.content.size_;
      if ((PromiseArena *)local_e0.content.size_ != (PromiseArena *)0x0) {
        pPVar8 = (PromiseArena *)local_e0.content.ptr;
      }
      memcpy(pPVar8,__addr,sVar9);
      pvVar5 = extraout_RDX_00;
    }
    HttpHeaders::clone(&local_c8,in_R8,pvVar5,__flags,__arg);
    RVar1.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)local_110.promise;
    local_68 = *in_R9;
    local_60 = *(PromiseArena **)(in_R9 + 8);
    pPVar8 = ((PromiseArenaMember *)local_110.promise.super_PromiseBase.node.ptr)->arena;
    if (pPVar8 == (PromiseArena *)0x0 ||
        (ulong)((long)local_110.promise.super_PromiseBase.node.ptr - (long)pPVar8) < 0xb0) {
      pvVar5 = operator_new(0x400);
      pTVar10 = (TransformPromiseNodeBase *)((long)pvVar5 + 0x350);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar10,(OwnPromiseNode *)&local_110,
                 kj::_::
                 SimpleTransformPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6560:15)>
                 ::anon_class_144_4_7ef71648_for_func::operator());
      *(undefined ***)((long)pvVar5 + 0x350) = &PTR_destroy_00704ff8;
      *(_func_int ***)((long)pvVar5 + 0x370) = local_e8._vptr_HttpClient;
      *(char **)((long)pvVar5 + 0x378) = local_e0.content.ptr;
      *(size_t *)((long)pvVar5 + 0x380) = local_e0.content.size_;
      *(ArrayDisposer **)((long)pvVar5 + 0x388) = local_e0.content.disposer;
      *(HttpHeaderTable **)((long)pvVar5 + 0x390) = local_c8.table;
      *(StringPtr **)((long)pvVar5 + 0x398) = local_c8.indexedHeaders.ptr;
      *(size_t *)((long)pvVar5 + 0x3a0) = local_c8.indexedHeaders.size_;
      *(ArrayDisposer **)((long)pvVar5 + 0x3a8) = local_c8.indexedHeaders.disposer;
      *(Header **)((long)pvVar5 + 0x3b0) = local_c8.unindexedHeaders.builder.ptr;
      *(RemoveConst<kj::HttpHeaders::Header> **)((long)pvVar5 + 0x3b8) =
           local_c8.unindexedHeaders.builder.pos;
      *(Header **)((long)pvVar5 + 0x3c0) = local_c8.unindexedHeaders.builder.endPtr;
      *(ArrayDisposer **)((long)pvVar5 + 0x3c8) = local_c8.unindexedHeaders.builder.disposer;
      *(Array<char> **)((long)pvVar5 + 0x3d0) = local_c8.ownedStrings.builder.ptr;
      *(RemoveConst<kj::Array<char>_> **)((long)pvVar5 + 0x3d8) = local_c8.ownedStrings.builder.pos;
      *(Array<char> **)((long)pvVar5 + 0x3e0) = local_c8.ownedStrings.builder.endPtr;
      *(ArrayDisposer **)((long)pvVar5 + 1000) = local_c8.ownedStrings.builder.disposer;
      *(undefined1 *)((long)pvVar5 + 0x3f0) = local_68;
      *(PromiseArena **)((long)pvVar5 + 0x3f8) = local_60;
      *(void **)((long)pvVar5 + 0x358) = pvVar5;
    }
    else {
      ((PromiseArenaMember *)local_110.promise.super_PromiseBase.node.ptr)->arena =
           (PromiseArena *)0x0;
      pTVar10 = (TransformPromiseNodeBase *)
                ((long)local_110.promise.super_PromiseBase.node.ptr + -0xb0);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar10,(OwnPromiseNode *)&local_110,
                 kj::_::
                 SimpleTransformPromiseNode<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6560:15)>
                 ::anon_class_144_4_7ef71648_for_func::operator());
      ((PromiseArenaMember *)((long)RVar1.super_PromiseBase.node.ptr + -0xb0))->
      _vptr_PromiseArenaMember = (_func_int **)&PTR_destroy_00704ff8;
      ((PromiseArenaMember *)((long)RVar1.super_PromiseBase.node.ptr + -0x90))->
      _vptr_PromiseArenaMember = local_e8._vptr_HttpClient;
      ((PromiseArenaMember *)((long)RVar1.super_PromiseBase.node.ptr + -0x90))->arena =
           (PromiseArena *)local_e0.content.ptr;
      ((PromiseArenaMember *)((long)RVar1.super_PromiseBase.node.ptr + -0x80))->
      _vptr_PromiseArenaMember = (_func_int **)local_e0.content.size_;
      ((PromiseArenaMember *)((long)RVar1.super_PromiseBase.node.ptr + -0x80))->arena =
           (PromiseArena *)local_e0.content.disposer;
      ((PromiseArenaMember *)((long)RVar1.super_PromiseBase.node.ptr + -0x70))->
      _vptr_PromiseArenaMember = (_func_int **)local_c8.table;
      ((PromiseArenaMember *)((long)RVar1.super_PromiseBase.node.ptr + -0x70))->arena =
           (PromiseArena *)local_c8.indexedHeaders.ptr;
      ((PromiseArenaMember *)((long)RVar1.super_PromiseBase.node.ptr + -0x60))->
      _vptr_PromiseArenaMember = (_func_int **)local_c8.indexedHeaders.size_;
      ((PromiseArenaMember *)((long)RVar1.super_PromiseBase.node.ptr + -0x60))->arena =
           (PromiseArena *)local_c8.indexedHeaders.disposer;
      ((PromiseArenaMember *)((long)RVar1.super_PromiseBase.node.ptr + -0x50))->
      _vptr_PromiseArenaMember = (_func_int **)local_c8.unindexedHeaders.builder.ptr;
      ((PromiseArenaMember *)((long)RVar1.super_PromiseBase.node.ptr + -0x50))->arena =
           (PromiseArena *)local_c8.unindexedHeaders.builder.pos;
      ((PromiseArenaMember *)((long)RVar1.super_PromiseBase.node.ptr + -0x40))->
      _vptr_PromiseArenaMember = (_func_int **)local_c8.unindexedHeaders.builder.endPtr;
      ((PromiseArenaMember *)((long)RVar1.super_PromiseBase.node.ptr + -0x40))->arena =
           (PromiseArena *)local_c8.unindexedHeaders.builder.disposer;
      ((PromiseArenaMember *)((long)RVar1.super_PromiseBase.node.ptr + -0x30))->
      _vptr_PromiseArenaMember = (_func_int **)local_c8.ownedStrings.builder.ptr;
      ((PromiseArenaMember *)((long)RVar1.super_PromiseBase.node.ptr + -0x30))->arena =
           (PromiseArena *)local_c8.ownedStrings.builder.pos;
      ((PromiseArenaMember *)((long)RVar1.super_PromiseBase.node.ptr + -0x20))->
      _vptr_PromiseArenaMember = (_func_int **)local_c8.ownedStrings.builder.endPtr;
      ((PromiseArenaMember *)((long)RVar1.super_PromiseBase.node.ptr + -0x20))->arena =
           (PromiseArena *)local_c8.ownedStrings.builder.disposer;
      *(undefined1 *)
       &((PromiseArenaMember *)((long)RVar1.super_PromiseBase.node.ptr + -0x10))->
        _vptr_PromiseArenaMember = local_68;
      ((PromiseArenaMember *)((long)RVar1.super_PromiseBase.node.ptr + -0x10))->arena = local_60;
      ((PromiseArenaMember *)((long)RVar1.super_PromiseBase.node.ptr + -0xb0))->arena = pPVar8;
    }
    local_60 = (PromiseArena *)0x0;
    local_c8.ownedStrings.builder.endPtr = (Array<char> *)0x0;
    local_c8.ownedStrings.builder.pos = (RemoveConst<kj::Array<char>_> *)0x0;
    local_c8.ownedStrings.builder.ptr = (Array<char> *)0x0;
    local_c8.unindexedHeaders.builder.endPtr = (Header *)0x0;
    local_c8.unindexedHeaders.builder.pos = (RemoveConst<kj::HttpHeaders::Header> *)0x0;
    local_c8.unindexedHeaders.builder.ptr = (Header *)0x0;
    local_c8.indexedHeaders.size_ = 0;
    local_c8.indexedHeaders.ptr = (StringPtr *)0x0;
    local_e0.content.size_ = 0;
    local_e0.content.ptr = (char *)0x0;
    local_58 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
    ;
    pcStack_50 = "connect";
    local_48 = 0x120000199f;
    location_00.function = "connect";
    location_00.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
    ;
    location_00.lineNumber = 0x199f;
    location_00.columnNumber = 0x12;
    local_f0 = pTVar10;
    Promise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>_>
    ::split((Promise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>_>
             *)&local_120,location_00);
    pTVar10 = local_f0;
    if (local_f0 != (TransformPromiseNodeBase *)0x0) {
      local_f0 = (TransformPromiseNodeBase *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pTVar10);
    }
    HttpHeaders::~HttpHeaders(&local_c8);
    sVar9 = local_e0.content.size_;
    pcVar3 = local_e0.content.ptr;
    if (local_e0.content.ptr != (char *)0x0) {
      local_e0.content.ptr = (char *)0x0;
      local_e0.content.size_ = 0;
      (**(local_e0.content.disposer)->_vptr_ArrayDisposer)
                (local_e0.content.disposer,pcVar3,1,sVar9,sVar9,0);
    }
    std::
    queue<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::deque<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>_>
    ::push(&this_00->pendingRequests,&local_110.fulfiller);
    fireCountChanged(this_00);
    local_f8.node.ptr = (OwnPromiseNode)(OwnPromiseNode)OStack_118.ptr;
    (this->super_HttpClient)._vptr_HttpClient = local_120._vptr_HttpClient;
    local_120._vptr_HttpClient = (_func_int **)0x0;
    OStack_118.ptr = (PromiseNode *)0x0;
    newPromisedStream((kj *)&this->inner,
                      (Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)&local_f8);
    node_01.node.ptr = local_f8.node.ptr;
    if (local_f8.node.ptr != (PromiseNode *)0x0) {
      local_f8.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node_01.node.ptr);
    }
    node_00.ptr = (PromiseNode *)OStack_118;
    if (&(OStack_118.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      OStack_118.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(node_00.ptr)->super_PromiseArenaMember);
    }
    node._vptr_HttpClient = local_120._vptr_HttpClient;
    if ((PromiseArenaMember *)local_120._vptr_HttpClient != (PromiseArenaMember *)0x0) {
      local_120._vptr_HttpClient = (_func_int **)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node._vptr_HttpClient);
    }
    pPVar2 = local_110.fulfiller.ptr;
    if (local_110.fulfiller.ptr !=
        (PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
         *)0x0) {
      local_110.fulfiller.ptr =
           (PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
            *)0x0;
      (**(local_110.fulfiller.disposer)->_vptr_Disposer)
                (local_110.fulfiller.disposer,
                 (pPVar2->super_PromiseRejector)._vptr_PromiseRejector[-2] +
                 (long)&(pPVar2->super_PromiseRejector)._vptr_PromiseRejector);
    }
    RVar1.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)local_110.promise;
    if (local_110.promise.super_PromiseBase.node.ptr != (OwnPromiseNode)0x0) {
      local_110.promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)RVar1.super_PromiseBase.node.ptr);
    }
  }
  return (int)this;
}

Assistant:

ConnectRequest connect(
      kj::StringPtr host, const kj::HttpHeaders& headers, HttpConnectSettings settings) override {
    if (concurrentRequests < maxConcurrentRequests) {
      auto counter = ConnectionCounter(*this);
      auto response = inner.connect(host, headers, settings);
      fireCountChanged();
      return attachCounter(kj::mv(response), kj::mv(counter));
    }

    auto paf = kj::newPromiseAndFulfiller<ConnectionCounter>();

    auto split = paf.promise
        .then([this, host=kj::str(host), headers=headers.clone(), settings]
              (ConnectionCounter&& counter) mutable
                  -> kj::Tuple<kj::Promise<ConnectRequest::Status>,
                               kj::Promise<kj::Own<kj::AsyncIoStream>>> {
      auto request = attachCounter(inner.connect(host, headers, settings), kj::mv(counter));
      return kj::tuple(kj::mv(request.status), kj::mv(request.connection));
    }).split();

    pendingRequests.push(kj::mv(paf.fulfiller));
    fireCountChanged();

    return ConnectRequest {
      kj::mv(kj::get<0>(split)),
      kj::newPromisedStream(kj::mv(kj::get<1>(split)))
    };
  }